

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Player * __thiscall World::Login(World *this,string *username,secure_string *password)

{
  pointer pcVar1;
  LoginReply LVar2;
  Player *this_00;
  string local_40;
  
  LVar2 = LoginCheck(this,username,password);
  if (LVar2 == LOGIN_WRONG_USERPASS) {
    this_00 = (Player *)0x0;
  }
  else {
    this_00 = (Player *)operator_new(0x80);
    pcVar1 = (username->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + username->_M_string_length);
    Player::Player(this_00,&local_40,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00;
}

Assistant:

Player *World::Login(const std::string& username, util::secure_string&& password)
{
	if (LoginCheck(username, std::move(password)) == LOGIN_WRONG_USERPASS)
		return 0;

	return new Player(username, this);
}